

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int timer_less_than(heap_node *ha,heap_node *hb)

{
  uv_timer_t *b;
  uv_timer_t *a;
  heap_node *hb_local;
  heap_node *ha_local;
  
  if (ha[1].left < hb[1].left) {
    ha_local._4_4_ = 1;
  }
  else if (hb[1].left < ha[1].left) {
    ha_local._4_4_ = 0;
  }
  else {
    ha_local._4_4_ = (uint)(ha[1].parent < hb[1].parent);
  }
  return ha_local._4_4_;
}

Assistant:

static int timer_less_than(const struct heap_node* ha,
                           const struct heap_node* hb) {
  const uv_timer_t* a;
  const uv_timer_t* b;

  a = container_of(ha, uv_timer_t, node.heap);
  b = container_of(hb, uv_timer_t, node.heap);

  if (a->timeout < b->timeout)
    return 1;
  if (b->timeout < a->timeout)
    return 0;

  /* Compare start_id when both have the same timeout. start_id is
   * allocated with loop->timer_counter in uv_timer_start().
   */
  return a->start_id < b->start_id;
}